

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Abc_ExactNormalizeArrivalTimesForNetwork(int nVars,int *pArrTimeProfile,char *pSol)

{
  size_t __size;
  char cVar1;
  char cVar2;
  char cVar3;
  Vec_Int_t *p;
  long lVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint i;
  ulong uVar9;
  int iVar10;
  int nMax;
  int local_34;
  
  cVar1 = pSol[2];
  uVar7 = (uint)cVar1;
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = nVars;
  p->nCap = nVars;
  lVar4 = (long)nVars;
  __size = lVar4 * 4;
  piVar5 = (int *)malloc(__size);
  p->pArray = piVar5;
  memcpy(piVar5,pArrTimeProfile,__size);
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      cVar2 = pSol[uVar9 * 4 + 5];
      if ((((cVar2 < '\0') || (p->nSize <= (int)cVar2)) ||
          (cVar3 = pSol[uVar9 * 4 + 6], cVar3 < '\0')) || ((uint)p->nSize <= (uint)(int)cVar3))
      goto LAB_002b02ea;
      iVar10 = p->pArray[(uint)(int)cVar2];
      iVar6 = p->pArray[(uint)(int)cVar3];
      if (iVar6 < iVar10) {
        iVar6 = iVar10;
      }
      Vec_IntPush(p,iVar6 + 1);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  iVar10 = uVar7 + nVars;
  if (1 < iVar10) {
    uVar8 = 0;
    do {
      if (p->nSize < iVar10) goto LAB_002b02ea;
      Vec_IntSetEntry(p,uVar8,p->pArray[iVar10 - 1U]);
      uVar8 = uVar8 + 1;
    } while (iVar10 - 1U != uVar8);
  }
  if ('\0' < cVar1) {
    uVar9 = (long)(int)uVar7 + 1;
    do {
      uVar7 = (uint)pSol[uVar9 * 4 + -3];
      if (((pSol[uVar9 * 4 + -3] < '\0') || (p->nSize <= (int)uVar7)) ||
         (((long)(lVar4 + uVar9 + -2) < 0 ||
          (uVar8 = (nVars + (int)uVar9) - 2, (uint)p->nSize <= uVar8)))) {
LAB_002b02ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      cVar1 = pSol[uVar9 * 4 + -2];
      i = (uint)cVar1;
      iVar10 = p->pArray[uVar7];
      iVar6 = p->pArray[lVar4 + (uVar9 - 2)] + -1;
      if (iVar10 < iVar6) {
        iVar6 = iVar10;
      }
      Vec_IntSetEntry(p,uVar7,iVar6);
      if (((cVar1 < '\0') || (p->nSize <= (int)i)) || ((uint)p->nSize <= uVar8)) goto LAB_002b02ea;
      iVar10 = p->pArray[i];
      iVar6 = p->pArray[lVar4 + (uVar9 - 2)] + -1;
      if (iVar10 < iVar6) {
        iVar6 = iVar10;
      }
      Vec_IntSetEntry(p,i,iVar6);
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  piVar5 = p->pArray;
  Abc_NormalizeArrivalTimes(piVar5,nVars,&local_34);
  memcpy(pArrTimeProfile,piVar5,__size);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(p);
  return;
}

Assistant:

static void Abc_ExactNormalizeArrivalTimesForNetwork( int nVars, int * pArrTimeProfile, char * pSol )
{
    int nGates, i, j, k, nMax;
    Vec_Int_t * vLevels;

    nGates = pSol[ABC_EXACT_SOL_NGATES];

    /* printf( "NORMALIZE\n" ); */
    /* printf( "  #vars  = %d\n", nVars ); */
    /* printf( "  #gates = %d\n", nGates ); */

    vLevels = Vec_IntAllocArrayCopy( pArrTimeProfile, nVars );

    /* compute level of each gate based on arrival time profile (to compute depth) */
    for ( i = 0; i < nGates; ++i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntPush( vLevels, Abc_MaxInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, k ) ) + 1 );

        /* printf( "  gate %d = (%d,%d)\n", nVars + i, j, k ); */
    }

    /* Vec_IntPrint( vLevels ); */

    /* reset all levels except for the last one */
    for ( i = 0; i < nVars + nGates - 1; ++i )
        Vec_IntSetEntry( vLevels, i, Vec_IntEntry( vLevels, nVars + nGates - 1 ) );

    /* Vec_IntPrint( vLevels ); */

    /* compute levels from top to bottom */
    for ( i = nGates - 1; i >= 0; --i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntSetEntry( vLevels, j, Abc_MinInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
        Vec_IntSetEntry( vLevels, k, Abc_MinInt( Vec_IntEntry( vLevels, k ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
    }

    /* Vec_IntPrint( vLevels ); */

    /* normalize arrival times */
    Abc_NormalizeArrivalTimes( Vec_IntArray( vLevels ), nVars, &nMax );
    memcpy( pArrTimeProfile, Vec_IntArray( vLevels ), sizeof(int) * nVars );

    /* printf( "  nMax = %d\n", nMax ); */
    /* Vec_IntPrint( vLevels ); */

    Vec_IntFree( vLevels );
}